

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

int tree_print_aug_target(lyout *out,int line_printed,uint8_t indent,char *path,tp_opts *opts)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *next;
  char *cur;
  int len;
  int is_last;
  int printed;
  tp_opts *opts_local;
  char *path_local;
  uint8_t indent_local;
  int line_printed_local;
  lyout *out_local;
  
  next = path;
  len = line_printed;
  do {
    pcVar3 = strchr(next + 1,0x2f);
    if (pcVar3 != (char *)0x0) {
      cur._4_4_ = (int)pcVar3 - (int)next;
    }
    else {
      sVar4 = strlen(next);
      cur._4_4_ = (int)sVar4 + 1;
    }
    bVar1 = pcVar3 == (char *)0x0;
    if (((opts->line_length != 0) && (next != path)) &&
       ((int)(uint)opts->line_length < (int)(len + cur._4_4_))) {
      iVar2 = ly_print(out,"\n%*s",(ulong)(line_printed + (uint)indent),"");
      len = iVar2 + -1;
    }
    pcVar5 = "";
    if (bVar1) {
      pcVar5 = ":";
    }
    iVar2 = ly_print(out,"%.*s%s",(ulong)cur._4_4_,next,pcVar5);
    len = iVar2 + len;
    next = pcVar3;
  } while (!bVar1);
  return len;
}

Assistant:

static int
tree_print_aug_target(struct lyout *out, int line_printed, uint8_t indent, const char *path, tp_opts *opts)
{
    int printed, is_last, len;
    const char *cur, *next;

    printed = line_printed;
    cur = path;
    do {
        next = strchr(cur + 1, '/');
        if (!next) {
            len = strlen(cur) + 1;
            is_last = 1;
        } else {
            len = next - cur;
            is_last = 0;
        }

        if (opts->line_length && cur != path && (printed + len > opts->line_length)) {
            /* line_printed is treated as the base indent */
            printed = ly_print(out, "\n%*s", line_printed + indent, "");
            /* minus the newline */
            --printed;
        }
        printed += ly_print(out, "%.*s%s", len, cur, is_last ? ":" : "");

        cur = next;
    } while (!is_last);

    return printed;
}